

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1d0ce::TestFailingTestHasFailures::~TestFailingTestHasFailures
          (TestFailingTestHasFailures *this)

{
  TestFailingTestHasFailures *this_local;
  
  ~TestFailingTestHasFailures(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(FailingTestHasFailures)
{
    class FailingTest : public Test
    {
    public:
        FailingTest() : Test("failing") {}
        virtual void RunImpl() const
        {
            CHECK(false);
        }
    };

    TestResults results;
	{
		ScopedCurrentTest scopedResults(results);
		FailingTest().Run();
	}

    CHECK_EQUAL(1, results.GetFailureCount());
}